

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  TextureFormat TVar1;
  RenderContext *context;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar9;
  Vec4 *pVVar10;
  ostream *poVar11;
  int i;
  Surface *pSVar12;
  long lVar13;
  void *__buf;
  void *__buf_00;
  bool bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  int iVar20;
  float fVar21;
  Surface renderedImg;
  Vector<float,_4> res_1;
  Vec4 inputClr;
  Surface errorMask;
  Random rnd;
  Vector<float,_4> res;
  int local_318;
  Surface local_300;
  string local_2e8;
  string local_2c8;
  int local_2a8;
  int local_2a4;
  Surface local_2a0;
  long local_288;
  char *local_280;
  Vec4 local_278;
  deRandom local_268;
  undefined1 local_258 [8];
  _func_int **pp_Stack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [4];
  ios_base local_1e0 [272];
  Quad local_d0;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_268,dVar5);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
  if (0xff < iVar6) {
    iVar6 = 0x100;
  }
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var_00,iVar7) + 4);
  iVar20 = 0x100;
  if (iVar7 < 0x100) {
    iVar20 = iVar7;
  }
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)CONCAT44(extraout_var_01,iVar7);
  dVar5 = deRandom_getUint32(&local_268);
  uVar15 = dVar5 % ((iVar7 - iVar6) + 1U);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var_02,iVar7) + 4);
  dVar5 = deRandom_getUint32(&local_268);
  uVar17 = dVar5 % ((iVar7 - iVar20) + 1U);
  local_278.m_data[0] = 0.0;
  local_278.m_data[1] = 0.0;
  local_278.m_data[2] = 0.0;
  local_278.m_data[3] = 0.0;
  local_d0.posA.m_data[0] = -1.0;
  local_d0.posA.m_data[1] = -1.0;
  local_d0.posB.m_data = (float  [2])&DAT_3f8000003f800000;
  memset(local_d0.color,0,0x90);
  tcu::Surface::Surface(&local_300,iVar6,iVar20);
  glwViewport(uVar15,uVar17,iVar6,iVar20);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0xfe);
  local_258 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_250,"Dithering is ",0xd);
  pcVar18 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)this->m_ditheringEnabled != 0) {
    pcVar18 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_250,pcVar18 + 0x27,8 - (ulong)this->m_ditheringEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_250);
  std::ios_base::~ios_base(local_1e0);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar5 = glwGetError();
    iVar7 = 0x103;
    pcVar18 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar5 = glwGetError();
    iVar7 = 0x105;
    pcVar18 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar5,pcVar18,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,iVar7);
  local_258 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_250,"Drawing a ",10);
  pcVar18 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar18 = "vertically";
  }
  uVar9 = (ulong)!isVerticallyIncreasing;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_250,pcVar18,uVar9 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_250," increasing gradient",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_250);
  std::ios_base::~ios_base(local_1e0);
  local_d0.color[0].m_data[0] = 0.0;
  local_d0.color[0].m_data[1] = 0.0;
  local_d0.color[0].m_data[2] = 0.0;
  local_d0.color[0].m_data[3] = 0.0;
  pVVar10 = &local_278;
  if (isVerticallyIncreasing) {
    pVVar10 = highColor;
  }
  local_d0.color[1].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  local_d0.color[1].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  pVVar10 = &local_278;
  if (!isVerticallyIncreasing) {
    pVVar10 = highColor;
  }
  local_d0.color[2].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
  local_d0.color[2].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
  local_d0.color[3].m_data._0_8_ = *(undefined8 *)highColor->m_data;
  local_d0.color[3].m_data._8_8_ = *(undefined8 *)(highColor->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&local_d0);
  context = this->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_300.m_pixels.m_cap != (void *)0x0) {
    local_300.m_pixels.m_cap = (size_t)local_300.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_258,(TextureFormat *)&local_2c8,local_300.m_width,
             local_300.m_height,1,(void *)local_300.m_pixels.m_cap);
  glu::readPixels(context,uVar15,uVar17,(PixelBufferAccess *)local_258);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x111);
  pcVar18 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar18 = "VerGradient";
  }
  pcVar3 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar3 = "VerGradient";
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,pcVar18,pcVar3 + 0xb);
  pcVar18 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar18 = "Vertical gradient";
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,pcVar18,pcVar18 + uVar9 * 2 + 0x11);
  pSVar12 = &local_300;
  tcu::LogImage::LogImage
            ((LogImage *)local_258,&local_2c8,&local_2e8,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_258,TVar1.order,__buf,(size_t)pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != local_228) {
    operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
  }
  if (local_258 != (undefined1  [8])&local_248) {
    operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface(&local_2a0,iVar6,iVar20);
  if (0 < local_300.m_height) {
    iVar6 = 0;
    bVar14 = true;
    do {
      if (0 < local_300.m_width) {
        iVar7 = 0;
        do {
          iVar20 = iVar7;
          if (isVerticallyIncreasing) {
            iVar20 = iVar6;
          }
          iVar16 = local_300.m_height;
          if (!isVerticallyIncreasing) {
            iVar16 = local_300.m_width;
          }
          fVar21 = ((float)iVar20 + 0.5) / (float)iVar16;
          local_258._0_4_ = R;
          local_258._4_4_ = SNORM_INT8;
          pp_Stack_250 = (_func_int **)0x0;
          lVar13 = 0;
          do {
            *(float *)(local_258 + lVar13 * 4) = local_278.m_data[lVar13] * (1.0 - fVar21);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          local_2e8._M_dataplus._M_p = (pointer)0x0;
          local_2e8._M_string_length = 0;
          lVar13 = 0;
          do {
            *(float *)((long)&local_2e8._M_dataplus._M_p + lVar13 * 4) =
                 highColor->m_data[lVar13] * fVar21;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          local_2c8._M_dataplus._M_p = (pointer)0x0;
          local_2c8._M_string_length = 0;
          lVar13 = 0;
          do {
            *(float *)((long)&local_2c8._M_dataplus._M_p + lVar13 * 4) =
                 *(float *)(local_258 + lVar13 * 4) +
                 *(float *)((long)&local_2e8._M_dataplus._M_p + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          local_258._0_4_ =
               *(ChannelOrder *)
                ((long)local_300.m_pixels.m_ptr + (long)(local_300.m_width * iVar6 + iVar7) * 4);
          bVar4 = checkColor(this,(Vec4 *)&local_2c8,(RGBA *)local_258,bVar14);
          lVar13 = (long)(local_2a0.m_width * iVar6 + iVar7);
          if (bVar4) {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar13 * 4) = 0xff00ff00;
          }
          else {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar13 * 4) = 0xff0000ff;
            if (bVar14 != false) {
              local_258 = (undefined1  [8])TVar1;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_250);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_250,"First failure at pixel (",0x18);
              std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_250,", ",2);
              std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pp_Stack_250,") (not printing further errors)",0x1f);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_250);
              std::ios_base::~ios_base(local_1e0);
              bVar14 = false;
            }
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_300.m_width);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_300.m_height);
    if (bVar14 == false) {
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,"ColorChoiceErrorMask","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Error mask for color choices","");
      pSVar12 = &local_2a0;
      tcu::LogImage::LogImage
                ((LogImage *)local_258,&local_2c8,&local_2e8,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_258,TVar1.order,__buf_00,(size_t)pSVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != local_228) {
        operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
      }
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface(&local_2a0);
      bVar14 = false;
      goto LAB_01232eb7;
    }
  }
  tcu::Surface::~Surface(&local_2a0);
  bVar14 = true;
  if (this->m_ditheringEnabled == false) {
    local_2a4 = local_300.m_height;
    local_2a8 = local_300.m_width;
    if (isVerticallyIncreasing) {
      local_2a4 = local_300.m_width;
      local_2a8 = local_300.m_height;
    }
    if (0 < local_2a8) {
      bVar14 = 0 < local_2a4;
      local_280 = "column";
      if (isVerticallyIncreasing) {
        local_280 = "row";
      }
      local_288 = uVar9 * 3 + 3;
      local_318 = 0;
      bVar4 = false;
      iVar6 = local_2a4;
      do {
        bVar19 = bVar14;
        if (0 < iVar6) {
          iVar7 = 0;
          uVar15 = 0;
          do {
            iVar16 = iVar7;
            iVar20 = local_318;
            if (isVerticallyIncreasing) {
              iVar16 = local_318;
              iVar20 = iVar7;
            }
            uVar17 = *(uint *)((long)local_300.m_pixels.m_ptr +
                              (long)(local_300.m_width * iVar16 + iVar20) * 4);
            bVar2 = true;
            if ((iVar7 != 0) && (uVar17 != uVar15)) {
              bVar2 = true;
              if (bVar4) {
                local_258 = (undefined1  [8])TVar1;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_250);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,"Failure: colors should be constant per ",0x27);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,local_280,local_288);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,
                           " (since dithering is disabled), but the color at position (",0x3b);
                std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar20);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_250,", ",2);
                std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,") is ",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,"RGBA(",5);
                poVar11 = (ostream *)
                          std::ostream::operator<<((ostringstream *)&pp_Stack_250,uVar17 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250," and does not equal the color at (",0x22);
                iVar6 = local_318;
                if (isVerticallyIncreasing) {
                  iVar6 = iVar7 + -1;
                }
                std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_250,", ",2);
                iVar6 = iVar7 + -1;
                if (isVerticallyIncreasing) {
                  iVar6 = local_318;
                }
                std::ostream::operator<<((ostringstream *)&pp_Stack_250,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,"), which is ",0xc);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pp_Stack_250,"RGBA(",5);
                poVar11 = (ostream *)
                          std::ostream::operator<<((ostringstream *)&pp_Stack_250,uVar15 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar15 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar15 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar15 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_250);
                std::ios_base::~ios_base(local_1e0);
                bVar2 = false;
                iVar6 = local_2a4;
                uVar17 = uVar15;
              }
              else {
                bVar4 = true;
              }
            }
            uVar15 = uVar17;
            if (!bVar2) {
              iVar7 = 1;
              goto LAB_01232d8a;
            }
            iVar7 = iVar7 + 1;
            bVar19 = iVar7 < iVar6;
          } while (iVar7 != iVar6);
        }
        iVar7 = 0;
LAB_01232d8a:
        if (bVar19) goto LAB_01232dac;
        local_318 = local_318 + 1;
      } while (local_318 != local_2a8);
    }
    iVar7 = 0xe;
LAB_01232dac:
    bVar14 = iVar7 == 0 || iVar7 == 0xe;
  }
LAB_01232eb7:
  tcu::Surface::~Surface(&local_300);
  return bVar14;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}